

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

Pseudo * linearize_bool(Proc *proc,AstNode *node,_Bool is_and)

{
  AstNode *expr;
  AstNode *expr_00;
  C_MemoryAllocator *pCVar1;
  BasicBlock *bb_to_start;
  BasicBlock *bb_to_start_00;
  Pseudo *target;
  Pseudo *pPVar2;
  BasicBlock *false_block;
  undefined7 in_register_00000011;
  BasicBlock *true_block;
  
  expr = (node->field_2).function_stmt.function_expr;
  expr_00 = (node->field_2).binary_expr.expr_right;
  bb_to_start = create_block(proc);
  bb_to_start_00 = create_block(proc);
  target = allocate_temp_pseudo(proc,RAVI_TANY,true);
  pPVar2 = linearize_expression(proc,expr);
  instruct_move(proc,op_mov,target,pPVar2,node->line_number);
  free_temp_pseudo(proc,pPVar2,false);
  false_block = bb_to_start;
  true_block = bb_to_start_00;
  if ((int)CONCAT71(in_register_00000011,is_and) != 0) {
    false_block = bb_to_start_00;
    true_block = bb_to_start;
  }
  instruct_cbr(proc,target,true_block,false_block,node->line_number);
  start_block(proc,bb_to_start,node->line_number);
  pPVar2 = linearize_expression(proc,expr_00);
  instruct_move(proc,op_mov,target,pPVar2,node->line_number);
  free_temp_pseudo(proc,pPVar2,false);
  pCVar1 = proc->linearizer->compiler_state->allocator;
  pPVar2 = (Pseudo *)(*pCVar1->calloc)(pCVar1->arena,1,0x30);
  *(uint *)pPVar2 = *(uint *)pPVar2 & 0xfffffff0 | 10;
  (pPVar2->field_3).block = bb_to_start_00;
  instruct_br(proc,pPVar2,node->line_number);
  start_block(proc,bb_to_start_00,node->line_number);
  return target;
}

Assistant:

static Pseudo *linearize_bool(Proc *proc, AstNode *node, bool is_and)
{
	AstNode *e1 = node->binary_expr.expr_left;
	AstNode *e2 = node->binary_expr.expr_right;

	BasicBlock *first_block = create_block(proc);
	BasicBlock *end_block = create_block(proc);

	// leave the result register on top of virtual stack
	Pseudo *result = allocate_temp_pseudo(proc, RAVI_TANY, true);
	Pseudo *operand1 = linearize_expression(proc, e1);
	instruct_move(proc, op_mov, result, operand1, node->line_number);
	free_temp_pseudo(proc, operand1, false);
	if (is_and)
		instruct_cbr(proc, result, first_block, end_block, node->line_number); // If first value is true then evaluate the second
	else
		instruct_cbr(proc, result, end_block, first_block, node->line_number);

	start_block(proc, first_block, node->line_number);
	Pseudo *operand2 = linearize_expression(proc, e2);
	instruct_move(proc, op_mov, result, operand2, node->line_number);
	free_temp_pseudo(proc, operand2, false);
	instruct_br(proc, allocate_block_pseudo(proc, end_block), node->line_number);

	start_block(proc, end_block, node->line_number);
	return result;
}